

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O2

void * adc_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *owner;
  _gobj *p_Var1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  t_float tVar5;
  t_atom defarg [2];
  
  owner = (t_object *)pd_new(adc_class);
  if (argc == 0) {
    defarg[0].a_type = A_FLOAT;
    defarg[0].a_w.w_index = 0x3f800000;
    defarg[1].a_w.w_index = 0x40000000;
    argc = 2;
    argv = defarg;
    defarg[1].a_type = defarg[0].a_type;
  }
  owner[1].te_g.g_pd = (t_pd)(long)argc;
  p_Var1 = (_gobj *)getbytes((long)argc * 8);
  owner[1].te_g.g_next = p_Var1;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < argc) {
    uVar3 = (ulong)(uint)argc;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    tVar5 = atom_getfloatarg((int)uVar4,argc,argv);
    (&(owner[1].te_g.g_next)->g_pd)[uVar4] = (t_pd)(long)tVar5;
  }
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    outlet_new(owner,&s_signal);
  }
  return owner;
}

Assistant:

static void *adc_new(t_symbol *s, int argc, t_atom *argv)
{
    t_adc *x = (t_adc *)pd_new(adc_class);
    t_atom defarg[2];
    int i;
    if (!argc)
    {
        argv = defarg;
        argc = 2;
        SETFLOAT(&defarg[0], 1);
        SETFLOAT(&defarg[1], 2);
    }
    x->x_n = argc;
    x->x_vec = (t_int *)getbytes(argc * sizeof(*x->x_vec));
    for (i = 0; i < argc; i++)
        x->x_vec[i] = atom_getfloatarg(i, argc, argv);
    for (i = 0; i < argc; i++)
        outlet_new(&x->x_obj, &s_signal);
    return (x);
}